

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall asl::HttpServer::serve(HttpServer *this,Socket *client)

{
  WebSocketServer *pWVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint end;
  String *s;
  size_t in_RCX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  HttpRequest *pHVar6;
  File *pFVar7;
  double dVar8;
  double dVar9;
  String range;
  String local_2d8;
  Array<asl::String> parts;
  String mime;
  String local_298;
  String hconn;
  File file;
  HttpRequest request;
  HttpResponse response;
  
  dVar8 = now();
  do {
    do {
      iVar5 = (*((client->super_SmartObject)._p)->_vptr_SmartObject_[5])();
      if ((char)iVar5 != '\0') {
        return;
      }
      dVar9 = now();
      if (10.0 <= dVar9 - dVar8) {
        return;
      }
      if ((this->super_SocketServer)._requestStop != false) {
        return;
      }
      bVar2 = Socket::waitData(client,5.0);
    } while (!bVar2);
    HttpRequest::HttpRequest(&request,client);
    if (((((client->super_SmartObject)._p[3].rc.n != 0) || (request._method._len < 1)) ||
        (request._path._len < 1)) || (request.super_HttpMessage._proto._len < 1)) {
LAB_001264a3:
      HttpRequest::~HttpRequest(&request);
      return;
    }
    String::String((String *)&file,"Connection");
    HttpMessage::header((String *)&response,&request.super_HttpMessage,(String *)&file);
    String::toLowerCase(&hconn,(String *)&response);
    String::~String((String *)&response);
    String::~String((String *)&file);
    String::String((String *)&file,"Upgrade");
    HttpMessage::header((String *)&response,&request.super_HttpMessage,(String *)&file);
    bVar2 = String::operator==((String *)&response,"websocket");
    if (bVar2) {
      pWVar1 = this->_wsserver;
      String::~String((String *)&response);
      String::~String((String *)&file);
      if (pWVar1 != (WebSocketServer *)0x0) {
        if (verbose == '\x01') {
          puts("handing over to ws");
        }
        WebSocketServer::process(this->_wsserver,client,&request.super_HttpMessage._headers);
        String::~String(&hconn);
        goto LAB_001264a3;
      }
    }
    else {
      String::~String((String *)&response);
      String::~String((String *)&file);
    }
    HttpResponse::HttpResponse(&response,&request);
    if (this->_cors == true) {
      String::String((String *)&file,"Origin");
      bVar2 = HttpMessage::hasHeader(&request.super_HttpMessage,(String *)&file);
      String::~String((String *)&file);
      if (bVar2) {
        String::String((String *)&file,"Access-Control-Allow-Origin");
        String::String(&range,"Origin");
        HttpMessage::header(&mime,&request.super_HttpMessage,&range);
        HttpMessage::setHeader(&response.super_HttpMessage,(String *)&file,&mime);
        String::~String(&mime);
        String::~String(&range);
        String::~String((String *)&file);
        String::String((String *)&file,"Access-Control-Allow-Credentials");
        String::String(&mime,"true");
        HttpMessage::setHeader(&response.super_HttpMessage,(String *)&file,&mime);
        String::~String(&mime);
        String::~String((String *)&file);
      }
    }
    bVar2 = String::operator==(&hconn,"keep-alive");
    if (bVar2) {
      String::String((String *)&file,"Connection");
      String::String(&mime,"keep-alive");
      HttpMessage::setHeader(&response.super_HttpMessage,(String *)&file,&mime);
      String::~String(&mime);
      String::~String((String *)&file);
    }
    iVar5 = (*(this->super_SocketServer)._vptr_SocketServer[2])(this,&request,&response);
    if ((char)iVar5 == '\0') {
      pHVar6 = &request;
      (*(this->super_SocketServer)._vptr_SocketServer[1])(this,pHVar6,&response);
      iVar5 = (int)pHVar6;
      __buf = extraout_RDX;
      if (*(int *)(response.super_HttpMessage._body._a + -0x10) == 0) {
        iVar5 = 0x142187;
        HttpMessage::put(&response.super_HttpMessage,"");
        __buf = extraout_RDX_00;
      }
      if (response._code == 0x195) {
        String::String((String *)&file,"Allow");
        pFVar7 = &file;
        HttpMessage::setHeader(&response.super_HttpMessage,(String *)&file,&this->_methods);
        iVar5 = (int)pFVar7;
        String::~String((String *)&file);
        __buf = extraout_RDX_01;
      }
      if (response.super_HttpMessage._fileBody != true) {
        HttpMessage::write(&response.super_HttpMessage,iVar5,__buf,in_RCX);
        goto LAB_001263f6;
      }
      HttpMessage::text(&mime,&response.super_HttpMessage);
      File::File(&file,&mime);
      String::~String(&mime);
      bVar2 = File::isFile(&file);
      if (bVar2) {
        File::extension(&range,&file);
        String::String(&local_2d8,"text/plain");
        s = Map<asl::String,_asl::String>::get
                      (&(this->_mimetypes).super_Map<asl::String,_asl::String>,&range,&local_2d8);
        String::String(&mime,s);
        String::~String(&local_2d8);
        String::~String(&range);
        String::String(&range,"Date");
        Date::now();
        Date::toString(&local_2d8,(Date *)&local_298,HTTP);
        HttpMessage::setHeader(&response.super_HttpMessage,&range,&local_2d8);
        String::~String(&local_2d8);
        String::~String(&range);
        String::String(&range,"Content-Type");
        bVar3 = HttpMessage::hasHeader(&response.super_HttpMessage,&range);
        String::~String(&range);
        if (!bVar3) {
          String::String(&range,"Content-Type");
          HttpMessage::setHeader(&response.super_HttpMessage,&range,&mime);
          String::~String(&range);
        }
        String::String(&range,"Cache-Control");
        bVar3 = HttpMessage::hasHeader(&response.super_HttpMessage,&range);
        String::~String(&range);
        if (!bVar3) {
          String::String(&range,"Cache-Control");
          String::String(&local_2d8,"max-age=60, public");
          HttpMessage::setHeader(&response.super_HttpMessage,&range,&local_2d8);
          String::~String(&local_2d8);
          String::~String(&range);
        }
        String::String(&range,"Range");
        bVar3 = HttpMessage::hasHeader(&request.super_HttpMessage,&range);
        String::~String(&range);
        if (bVar3) {
          String::String(&local_2d8,"Range");
          HttpMessage::header(&range,&request.super_HttpMessage,&local_2d8);
          String::~String(&local_2d8);
          bVar3 = String::startsWith(&range,"bytes=");
          if (bVar3) {
            bVar3 = String::contains(&range,',');
            if (!bVar3) {
              String::substr(&local_2d8,&range,6);
              String::String(&local_298,'-');
              String::split((String *)&parts,&local_2d8);
              String::~String(&local_298);
              String::~String(&local_2d8);
              iVar5 = String::operator_cast_to_int(parts._a);
              end = String::operator_cast_to_int(parts._a + 1);
              HttpResponse::setCode(&response,0xce);
              String::String(&local_2d8,"Content-Range");
              String::String(&local_298,"+");
              HttpMessage::setHeader(&response.super_HttpMessage,&local_2d8,&local_298);
              String::~String(&local_298);
              String::~String(&local_2d8);
              in_RCX = (size_t)end;
              HttpMessage::putFile(&response.super_HttpMessage,&file._path,iVar5,end);
              Array<asl::String>::~Array(&parts);
            }
          }
          String::~String(&range);
        }
        else {
          in_RCX = 0;
          HttpMessage::putFile(&response.super_HttpMessage,&file._path,0,0);
        }
        String::String(&range,"Content-Range");
        bVar3 = HttpMessage::hasHeader(&response.super_HttpMessage,&range);
        if (bVar3) {
          String::String(&local_298,"Content-Range");
          HttpMessage::header(&local_2d8,&response.super_HttpMessage,&local_298);
          bVar3 = String::contains(&local_2d8,'*');
          String::~String(&local_2d8);
          String::~String(&local_298);
          String::~String(&range);
          if (bVar3) {
            iVar5 = 0x1a0;
            HttpResponse::setCode(&response,0x1a0);
            HttpMessage::write(&response.super_HttpMessage,iVar5,__buf_01,in_RCX);
          }
        }
        else {
          String::~String(&range);
        }
        String::~String(&mime);
      }
      else {
        HttpResponse::setCode(&response,0x194);
        String::String(&mime,"Content-Type");
        String::String(&range,"text/plain");
        HttpMessage::setHeader(&response.super_HttpMessage,&mime,&range);
        String::~String(&range);
        String::~String(&mime);
        iVar5 = 0x1413a6;
        HttpMessage::put(&response.super_HttpMessage,"Not found");
        HttpMessage::write(&response.super_HttpMessage,iVar5,__buf_00,in_RCX);
      }
      bVar4 = 0;
      File::~File(&file);
      if (bVar2) goto LAB_001263f6;
    }
    else {
LAB_001263f6:
      bVar2 = String::operator==(&request.super_HttpMessage._proto,"HTTP/1.0");
      if (bVar2) {
        bVar2 = String::operator!=(&hconn,"keep-alive");
        bVar4 = 3;
        if (bVar2) goto LAB_0012643f;
      }
      bVar4 = String::operator==(&hconn,"close");
    }
LAB_0012643f:
    HttpMessage::~HttpMessage(&response.super_HttpMessage);
    String::~String(&hconn);
    HttpRequest::~HttpRequest(&request);
    if ((bVar4 & 1) != 0) {
      return;
    }
  } while( true );
}

Assistant:

void HttpServer::serve(Socket client)
{
	double t1 = now();
	while(client.connected() && now() - t1 < 10.0 && !_requestStop)
	{
		if (!client.waitData(5))
			continue;

		HttpRequest request(client);
		if (client.error() || !request.method().ok() || !request.path().ok() || !request.protocol().ok())
			break;

		String hconn = request.header("Connection").toLowerCase();

		if (request.header("Upgrade") == "websocket" && _wsserver)
		{
			if(verbose) printf("handing over to ws\n");
			_wsserver->process(client, request.headers());
			return;
		}

		HttpResponse response(request);

		if (_cors && request.hasHeader("Origin"))
		{
			response.setHeader("Access-Control-Allow-Origin", request.header("Origin"));
			response.setHeader("Access-Control-Allow-Credentials", "true");
		}

		if (hconn == "keep-alive")
			response.setHeader("Connection", "keep-alive");

		if (!handleOptions(request, response))
		{
			serve(request, response);

			if (!response.body())
				response.put("");

			if (response.code() == 405)
				response.setHeader("Allow", _methods);

			if (response.containsFile())
			{
				File file(response.text());
				if (!file.isFile())
				{
					response.setCode(404);
					response.setHeader("Content-Type", "text/plain");
					response.put("Not found");
					response.write();
					continue;
				}

				String mime = _mimetypes.get(file.extension(), "text/plain");
				response.setHeader("Date", Date::now().toString(Date::HTTP));
				if (!response.hasHeader("Content-Type"))
					response.setHeader("Content-Type", mime);
				
				if (!response.hasHeader("Cache-Control"))
					response.setHeader("Cache-Control", "max-age=60, public");
				
				if (request.hasHeader("Range"))
				{
					String range = request.header("Range");
					if (range.startsWith("bytes=") && !range.contains(',')) // no multiple ranges
					{
						Array<String> parts = range.substr(6).split('-');
						int begin = parts[0];
						int end = parts[1];
						response.setCode(206);
						response.setHeader("Content-Range", "+");
						response.putFile(file.path(), begin, end);
					}
				}
				else
					response.putFile(file.path());

				if (response.hasHeader("Content-Range") && response.header("Content-Range").contains('*'))
				{
					response.setCode(416);
					response.write();
				}
			}
			else
				response.write();
		}
		
		if ((request.protocol() == "HTTP/1.0" && hconn != "keep-alive") || hconn == "close")
			break;
	}
}